

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_suite.cpp
# Opt level: O0

void partition_real(void)

{
  index_type *piVar1;
  bool bVar2;
  iterator local_288;
  undefined1 local_26a [2];
  iterator local_268;
  iterator local_250;
  undefined1 local_233 [3];
  iterator local_230;
  iterator local_218;
  undefined1 local_200 [8];
  iterator where_2;
  variable data_2;
  undefined1 local_19a [2];
  iterator local_198;
  iterator local_180;
  undefined1 local_163 [3];
  iterator local_160;
  iterator local_148;
  undefined1 local_130 [8];
  iterator where_1;
  variable data_1;
  undefined1 local_ca [2];
  iterator local_c8;
  iterator local_b0;
  undefined1 local_93 [3];
  iterator local_90;
  iterator local_68;
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  piVar1 = &where.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)piVar1,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_68,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_90,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
            (local_50,&local_68,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_93[0] = std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
                          (&local_b0,&local_c8);
  local_ca[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<real>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x3b,"void partition_real()",local_93,local_ca);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&data_1.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_50,(iterator *)&data_1.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x3c,"void partition_real()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_1.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)piVar1,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_148,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_160,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
            (local_130,&local_148,&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_180,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_198,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_163[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
                           (&local_180,&local_198);
  local_19a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<real>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x41,"void partition_real()",local_163,local_19a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&data_2.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_130,(iterator *)&data_2.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x42,"void partition_real()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_130);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_2.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)piVar1,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_218,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_230,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
            (local_200,&local_218,&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_250,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_268,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_233[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
                           (&local_250,&local_268);
  local_26a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<real>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x47,"void partition_real()",local_233,local_26a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_250);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_288,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_200,&local_288);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x48,"void partition_real()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void partition_real()
{
    {
        variable data(3.0f);
        auto where = std::partition(data.begin(), data.end(), is<real>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<real>()), true);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable data(3.0);
        auto where = std::partition(data.begin(), data.end(), is<real>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<real>()), true);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable data(3.0L);
        auto where = std::partition(data.begin(), data.end(), is<real>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<real>()), true);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
}